

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int session_close_stream_on_goaway(nghttp2_session *session,int32_t last_stream_id,int incoming)

{
  int iVar1;
  nghttp2_stream *pnVar2;
  nghttp2_stream *pnVar3;
  nghttp2_close_stream_on_goaway_arg arg;
  
  arg.head = (nghttp2_stream *)0x0;
  arg.session = session;
  arg.last_stream_id = last_stream_id;
  arg.incoming = incoming;
  iVar1 = nghttp2_map_each(&session->streams,find_stream_on_goaway_func,&arg);
  pnVar2 = arg.head;
  if (iVar1 != 0) {
    __assert_fail("rv == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0xb09,"int session_close_stream_on_goaway(nghttp2_session *, int32_t, int)");
  }
  do {
    if (pnVar2 == (nghttp2_stream *)0x0) {
      return 0;
    }
    pnVar3 = pnVar2->closed_next;
    pnVar2->closed_next = (nghttp2_stream *)0x0;
    iVar1 = nghttp2_session_close_stream(session,pnVar2->stream_id,7);
    pnVar2 = pnVar3;
  } while (-0x385 < iVar1);
  while (pnVar3 != (nghttp2_stream *)0x0) {
    pnVar2 = pnVar3->closed_next;
    pnVar3->closed_next = (nghttp2_stream *)0x0;
    pnVar3 = pnVar2;
  }
  return iVar1;
}

Assistant:

static int session_close_stream_on_goaway(nghttp2_session *session,
                                          int32_t last_stream_id,
                                          int incoming) {
  int rv;
  nghttp2_stream *stream, *next_stream;
  nghttp2_close_stream_on_goaway_arg arg = {session, NULL, last_stream_id,
                                            incoming};

  rv = nghttp2_map_each(&session->streams, find_stream_on_goaway_func, &arg);
  assert(rv == 0);

  stream = arg.head;
  while (stream) {
    next_stream = stream->closed_next;
    stream->closed_next = NULL;
    rv = nghttp2_session_close_stream(session, stream->stream_id,
                                      NGHTTP2_REFUSED_STREAM);

    /* stream may be deleted here */

    stream = next_stream;

    if (nghttp2_is_fatal(rv)) {
      /* Clean up closed_next member just in case */
      while (stream) {
        next_stream = stream->closed_next;
        stream->closed_next = NULL;
        stream = next_stream;
      }
      return rv;
    }
  }

  return 0;
}